

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodePtr xmlXPathNextPreceding(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlXPathContextPtr pxVar1;
  _xmlNode *p_Var2;
  _xmlDoc *p_Var3;
  xmlNodePtr pxVar4;
  bool bVar5;
  
  if ((ctxt != (xmlXPathParserContextPtr)0x0) &&
     (pxVar1 = ctxt->context, pxVar1 != (xmlXPathContextPtr)0x0)) {
    if (cur == (xmlNodePtr)0x0) {
      cur = pxVar1->node;
      if (((_xmlDoc *)cur)->type == XML_NAMESPACE_DECL) {
        p_Var3 = (_xmlDoc *)((_xmlDoc *)cur)->_private;
        if (p_Var3 == (_xmlDoc *)0x0) {
          bVar5 = false;
        }
        else {
          bVar5 = p_Var3->type != XML_NAMESPACE_DECL;
          if (bVar5) {
            cur = (xmlNodePtr)p_Var3;
          }
        }
        if (!bVar5) {
          return (xmlNodePtr)0x0;
        }
      }
      else if (((_xmlDoc *)cur)->type == XML_ATTRIBUTE_NODE) {
        cur = ((_xmlDoc *)cur)->parent;
      }
    }
    if (((_xmlDoc *)cur != (_xmlDoc *)0x0) && (((_xmlDoc *)cur)->type != XML_NAMESPACE_DECL)) {
      p_Var3 = (_xmlDoc *)((_xmlDoc *)cur)->prev;
      if ((p_Var3 != (_xmlDoc *)0x0) && (p_Var3->type == XML_DTD_NODE)) {
        cur = (xmlNodePtr)p_Var3;
      }
      while( true ) {
        p_Var2 = ((_xmlDoc *)cur)->prev;
        if (((_xmlDoc *)cur)->prev != (xmlNodePtr)0x0) {
          do {
            pxVar4 = p_Var2;
            p_Var2 = pxVar4->last;
          } while (p_Var2 != (_xmlNode *)0x0);
          return pxVar4;
        }
        cur = ((_xmlDoc *)cur)->parent;
        if ((cur == (xmlNodePtr)0x0) || (cur == pxVar1->doc->children)) break;
        p_Var3 = (_xmlDoc *)pxVar1->node;
        if (p_Var3 == (_xmlDoc *)0x0) {
          return (xmlNodePtr)(_xmlDoc *)cur;
        }
        if (p_Var3->type == XML_NAMESPACE_DECL) {
          return (xmlNodePtr)(_xmlDoc *)cur;
        }
        if (((_xmlDoc *)cur)->type == XML_NAMESPACE_DECL) {
          return (xmlNodePtr)(_xmlDoc *)cur;
        }
        if (((_xmlDoc *)cur)->doc != p_Var3->doc) {
          return (xmlNodePtr)(_xmlDoc *)cur;
        }
        if (p_Var3->doc != (_xmlDoc *)cur) {
          if (((_xmlDoc *)cur)->doc == p_Var3) {
            return (xmlNodePtr)(_xmlDoc *)cur;
          }
          do {
            p_Var3 = (_xmlDoc *)p_Var3->parent;
            if (p_Var3 == (_xmlDoc *)0x0) {
              return (xmlNodePtr)(_xmlDoc *)cur;
            }
          } while (p_Var3 != (_xmlDoc *)cur);
        }
      }
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlXPathNextPreceding(xmlXPathParserContextPtr ctxt, xmlNodePtr cur)
{
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (cur == NULL) {
        cur = ctxt->context->node;
        if (cur->type == XML_ATTRIBUTE_NODE) {
            cur = cur->parent;
        } else if (cur->type == XML_NAMESPACE_DECL) {
            xmlNsPtr ns = (xmlNsPtr) cur;

            if ((ns->next == NULL) ||
                (ns->next->type == XML_NAMESPACE_DECL))
                return (NULL);
            cur = (xmlNodePtr) ns->next;
        }
    }
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL))
	return (NULL);
    if ((cur->prev != NULL) && (cur->prev->type == XML_DTD_NODE))
	cur = cur->prev;
    do {
        if (cur->prev != NULL) {
            for (cur = cur->prev; cur->last != NULL; cur = cur->last) ;
            return (cur);
        }

        cur = cur->parent;
        if (cur == NULL)
            return (NULL);
        if (cur == ctxt->context->doc->children)
            return (NULL);
    } while (xmlXPathIsAncestor(cur, ctxt->context->node));
    return (cur);
}